

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztetrahedron.cpp
# Opt level: O2

int pztopology::TPZTetrahedron::NumSides(int dimension)

{
  if (3 < (uint)dimension) {
    std::operator<<((ostream *)&std::cerr,"TPZTetrahedron::NumSides. Bad parameter i.\n");
    return 0;
  }
  if (dimension == 3) {
    return 1;
  }
  return *(int *)(&DAT_012ff5a4 + (ulong)(uint)dimension * 4);
}

Assistant:

int TPZTetrahedron::NumSides(int dimension) {		if(dimension<0 || dimension> 3) {
		PZError << "TPZTetrahedron::NumSides. Bad parameter i.\n";
		return 0;
	}
		if(dimension==0) return 4;
		if(dimension==1) return 6;
		if(dimension==2) return 4;
		if(dimension==3) return 1;
		return -1;
	}